

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Parser::_write_key_anchor(Parser *this,size_t node_id)

{
  Tree *pTVar1;
  code *pcVar2;
  Location LVar3;
  undefined1 auVar4 [24];
  csubstr ref;
  bool bVar5;
  int iVar6;
  csubstr *pcVar7;
  size_t sVar8;
  csubstr fmt;
  csubstr fmt_00;
  csubstr ref_00;
  char msg [41];
  csubstr r;
  basic_substring<const_char> local_88;
  char local_78 [8];
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68;
  undefined7 uStack_67;
  undefined1 uStack_60;
  basic_substring<const_char> local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  char *pcStack_30;
  undefined8 local_28;
  
  pTVar1 = this->m_tree;
  if ((node_id == 0xffffffffffffffff) || (pTVar1->m_cap <= node_id)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    local_88.str._0_4_ = 0;
    local_88.str._4_4_ = 0;
    local_88.len._0_4_ = 0x4b86;
    local_88.len._4_4_ = 0;
    local_78[0] = '\0';
    local_78[1] = '\0';
    local_78[2] = '\0';
    local_78[3] = '\0';
    local_78[4] = '\0';
    local_78[5] = '\0';
    local_78[6] = '\0';
    local_78[7] = '\0';
    uStack_70 = 0x1fcdc7;
    uStack_6c = 0;
    local_68 = 0x65;
    uStack_67 = 0;
    (*(code *)PTR_error_impl_0023f548)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((pTVar1->m_buf[node_id].m_type.type & KEY) == NOTYPE) {
    local_68 = 0x6f;
    uStack_67 = 0x292964695f6564;
    uStack_60 = 0;
    builtin_strncpy(local_78,"_tree->h",8);
    uStack_70 = 0x6b5f7361;
    uStack_6c = 0x6e287965;
    local_88.str._0_4_ = 0x63656863;
    local_88.str._4_4_ = 0x6166206b;
    local_88.len._0_4_ = 0x64656c69;
    local_88.len._4_4_ = 0x6d28203a;
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    local_48 = 0;
    uStack_40 = 0x76e1;
    local_38 = 0;
    pcStack_30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_28 = 0x65;
    auVar4 = ZEXT1224(ZEXT412(0x76e1) << 0x40);
    LVar3.name.str._0_4_ = 0x1fcdc7;
    LVar3.super_LineCol.offset = auVar4._0_8_;
    LVar3.super_LineCol.line = auVar4._8_8_;
    LVar3.super_LineCol.col = auVar4._16_8_;
    LVar3.name.str._4_4_ = 0;
    LVar3.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_88,0x29,LVar3,(this->m_stack).m_callbacks.m_user_data);
  }
  pTVar1 = this->m_tree;
  if ((this->m_key_anchor).str == (char *)0x0 || (this->m_key_anchor).len == 0) {
    if ((node_id == 0xffffffffffffffff) || (pTVar1->m_cap <= node_id)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      local_88.str._0_4_ = 0;
      local_88.str._4_4_ = 0;
      local_88.len._0_4_ = 0x4b86;
      local_88.len._4_4_ = 0;
      local_78[0] = '\0';
      local_78[1] = '\0';
      local_78[2] = '\0';
      local_78[3] = '\0';
      local_78[4] = '\0';
      local_78[5] = '\0';
      local_78[6] = '\0';
      local_78[7] = '\0';
      uStack_70 = 0x1fcdc7;
      uStack_6c = 0;
      local_68 = 0x65;
      uStack_67 = 0;
      (*(code *)PTR_error_impl_0023f548)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((~(int)pTVar1->m_buf[node_id].m_type.type & 0x2002U) != 0) {
      pcVar7 = Tree::key(this->m_tree,node_id);
      local_58.str = pcVar7->str;
      sVar8 = pcVar7->len;
      local_58.len = sVar8;
      if ((sVar8 == 0) || (*local_58.str != '*')) {
        iVar6 = basic_substring<const_char>::compare(&local_58,"<<",2);
        if (iVar6 == 0) {
          ref_00.len = sVar8;
          ref_00.str = local_58.str;
          Tree::set_key_ref(this->m_tree,node_id,ref_00);
          pTVar1 = this->m_tree;
          if ((node_id == 0xffffffffffffffff) || (pTVar1->m_cap <= node_id)) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
            local_88.str._0_4_ = 0;
            local_88.str._4_4_ = 0;
            local_88.len._0_4_ = 0x4b86;
            local_88.len._4_4_ = 0;
            local_78[0] = '\0';
            local_78[1] = '\0';
            local_78[2] = '\0';
            local_78[3] = '\0';
            local_78[4] = '\0';
            local_78[5] = '\0';
            local_78[6] = '\0';
            local_78[7] = '\0';
            uStack_70 = 0x1fcdc7;
            uStack_6c = 0;
            local_68 = 0x65;
            uStack_67 = 0;
            (*(code *)PTR_error_impl_0023f548)
                      ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                       (anonymous_namespace)::s_default_callbacks);
          }
          if ((pTVar1->m_buf[node_id].m_type.type & SEQ) == NOTYPE) {
            pcVar7 = Tree::val(this->m_tree,node_id);
            if ((pcVar7->len == 0) || (*pcVar7->str != '*')) {
              bVar5 = is_debugger_attached();
              if ((bVar5) && (bVar5 = is_debugger_attached(), bVar5)) {
                pcVar2 = (code *)swi(3);
                (*pcVar2)();
                return;
              }
              pcVar7 = Tree::val(this->m_tree,node_id);
              fmt.len = 0x20;
              fmt.str = "ERROR: malformed reference: \'{}\'";
              _err<c4::basic_substring<char_const>>(this,fmt,pcVar7);
            }
          }
          else {
            for (sVar8 = Tree::first_child(this->m_tree,node_id); sVar8 != 0xffffffffffffffff;
                sVar8 = Tree::next_sibling(this->m_tree,sVar8)) {
              pcVar7 = Tree::val(this->m_tree,sVar8);
              if ((pcVar7->len == 0) || (*pcVar7->str != '*')) {
                bVar5 = is_debugger_attached();
                if ((bVar5) && (bVar5 = is_debugger_attached(), bVar5)) {
                  pcVar2 = (code *)swi(3);
                  (*pcVar2)();
                  return;
                }
                pcVar7 = Tree::val(this->m_tree,sVar8);
                fmt_00.len = 0x20;
                fmt_00.str = "ERROR: malformed reference: \'{}\'";
                _err<c4::basic_substring<char_const>>(this,fmt_00,pcVar7);
              }
            }
          }
        }
      }
      else {
        pTVar1 = this->m_tree;
        basic_substring<const_char>::basic_substring(&local_88,local_58.str + 1,sVar8 - 1);
        ref.str._4_4_ = local_88.str._4_4_;
        ref.str._0_4_ = local_88.str._0_4_;
        ref.len._0_4_ = (undefined4)local_88.len;
        ref.len._4_4_ = local_88.len._4_4_;
        Tree::set_key_ref(pTVar1,node_id,ref);
      }
    }
  }
  else {
    Tree::set_key_anchor(pTVar1,node_id,this->m_key_anchor);
    this->m_key_anchor_was_before = false;
    this->m_key_anchor_indentation = 0;
    (this->m_key_anchor).str = (char *)0x0;
    (this->m_key_anchor).len = 0;
  }
  return;
}

Assistant:

void Parser::_write_key_anchor(size_t node_id)
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->has_key(node_id));
    if( ! m_key_anchor.empty())
    {
        _c4dbgpf("node={}: set key anchor to '{}'", node_id, m_key_anchor);
        m_tree->set_key_anchor(node_id, m_key_anchor);
        m_key_anchor.clear();
        m_key_anchor_was_before = false;
        m_key_anchor_indentation = 0;
    }
    else if( ! m_tree->is_key_quoted(node_id))
    {
        csubstr r = m_tree->key(node_id);
        if(r.begins_with('*'))
        {
            _c4dbgpf("node={}: set key reference: '{}'", node_id, r);
            m_tree->set_key_ref(node_id, r.sub(1));
        }
        else if(r == "<<")
        {
            m_tree->set_key_ref(node_id, r);
            _c4dbgpf("node={}: it's an inheriting reference", node_id);
            if(m_tree->is_seq(node_id))
            {
                _c4dbgpf("node={}: inheriting from seq of {}", node_id, m_tree->num_children(node_id));
                for(size_t i = m_tree->first_child(node_id); i != NONE; i = m_tree->next_sibling(i))
                {
                    if( ! (m_tree->val(i).begins_with('*')))
                        _c4err("malformed reference: '{}'", m_tree->val(i));
                }
            }
            else if( ! m_tree->val(node_id).begins_with('*'))
            {
                 _c4err("malformed reference: '{}'", m_tree->val(node_id));
            }
            //m_tree->set_key_ref(node_id, r);
        }
    }
}